

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O1

int finishpcall(lua_State *L,int status,lua_KContext extra)

{
  int iVar1;
  
  if ((uint)status < 2) {
    iVar1 = lua_gettop(L);
    iVar1 = iVar1 - (int)extra;
  }
  else {
    finishpcall();
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

static int finishpcall (lua_State *L, int status, lua_KContext extra) {
  if (l_unlikely(status != LUA_OK && status != LUA_YIELD)) {  /* error? */
    lua_pushboolean(L, 0);  /* first result (false) */
    lua_pushvalue(L, -2);  /* error message */
    return 2;  /* return false, msg */
  }
  else
    return lua_gettop(L) - (int)extra;  /* return all results */
}